

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Value_Slider.cxx
# Opt level: O1

void __thiscall Fl_Value_Slider::draw(Fl_Value_Slider *this)

{
  int X;
  int Y;
  int Y_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Fl_Color c;
  int X_00;
  int H;
  char buf [128];
  int local_c8;
  int local_c4;
  char local_b8 [136];
  
  X = (this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.x_;
  Y = (this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.y_;
  iVar5 = (this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.w_;
  H = (this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.h_;
  if (((this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.type_ & 1) == 0) {
    H = H + -0x19;
    local_c8 = 0x19;
    X_00 = X;
    Y_00 = Y + 0x19;
    local_c4 = iVar5;
  }
  else {
    X_00 = X + 0x23;
    iVar5 = iVar5 + -0x23;
    local_c4 = 0x23;
    Y_00 = Y;
    local_c8 = H;
  }
  if ((char)(this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.damage_ < '\0') {
    Fl_Widget::draw_box((Fl_Widget *)this,
                        (uint)(this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.box_,X_00,
                        Y_00,iVar5,H,
                        (this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.color_);
  }
  iVar1 = Fl::box_dx((uint)(this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.box_);
  iVar2 = Fl::box_dy((uint)(this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.box_);
  iVar3 = Fl::box_dw((uint)(this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.box_);
  iVar4 = Fl::box_dh((uint)(this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.box_);
  Fl_Slider::draw(&this->super_Fl_Slider,X_00 + iVar1,Y_00 + iVar2,iVar5 - iVar3,H - iVar4);
  Fl_Widget::draw_box((Fl_Widget *)this,
                      (uint)(this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.box_,X,Y,
                      local_c4,local_c8,
                      (this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.color_);
  (*(this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget._vptr_Fl_Widget[0xb])(this,local_b8);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
            (fl_graphics_driver,(ulong)*(uint *)&(this->super_Fl_Slider).field_0xac,
             (ulong)(uint)this->textsize_);
  iVar5 = Fl_Widget::active_r((Fl_Widget *)this);
  c = this->textcolor_;
  if (iVar5 == 0) {
    c = fl_inactive(c);
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)c);
  fl_draw(local_b8,X,Y,local_c4,local_c8,0x40,(Fl_Image *)0x0,1);
  return;
}

Assistant:

void Fl_Value_Slider::draw() {
  int sxx = x(), syy = y(), sww = w(), shh = h();
  int bxx = x(), byy = y(), bww = w(), bhh = h();
  if (horizontal()) {
    bww = 35; sxx += 35; sww -= 35;
  } else {
    syy += 25; bhh = 25; shh -= 25;
  }
  if (damage()&FL_DAMAGE_ALL) draw_box(box(),sxx,syy,sww,shh,color());
  Fl_Slider::draw(sxx+Fl::box_dx(box()),
		  syy+Fl::box_dy(box()),
		  sww-Fl::box_dw(box()),
		  shh-Fl::box_dh(box()));
  draw_box(box(),bxx,byy,bww,bhh,color());
  char buf[128];
  format(buf);
  fl_font(textfont(), textsize());
  fl_color(active_r() ? textcolor() : fl_inactive(textcolor()));
  fl_draw(buf, bxx, byy, bww, bhh, FL_ALIGN_CLIP);
}